

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  uint64_t *puVar1;
  Solver *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  vec<unsigned_int> *pvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  CRef cr;
  uint local_44;
  SimpSolver *local_40;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *local_38;
  
  if (this->use_simplification == true) {
    local_38 = &this->occurs;
    OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::cleanAll
              (local_38);
    iVar6 = (this->super_Solver).vardata.sz;
    if (0 < iVar6 && iVar6 <= (this->occurs).occs.sz) {
      pSVar2 = &this->super_Solver;
      lVar8 = 0;
      local_40 = this;
      do {
        pvVar7 = (local_38->occs).data;
        iVar6 = pvVar7[lVar8].sz;
        if (0 < iVar6) {
          pvVar7 = pvVar7 + lVar8;
          lVar10 = 0;
          lVar9 = 0;
          do {
            ClauseAllocator::reloc(&pSVar2->ca,(CRef *)((long)pvVar7->data + lVar10),to);
            lVar9 = lVar9 + 1;
            iVar6 = pvVar7->sz;
            lVar10 = lVar10 + 4;
            this = local_40;
          } while (lVar9 < iVar6);
        }
        puVar1 = &(this->super_Solver).statistics.simpSteps;
        *puVar1 = *puVar1 + (long)iVar6;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->super_Solver).vardata.sz);
    }
    iVar6 = (this->subsumption_queue).first;
    iVar3 = (this->subsumption_queue).end;
    iVar5 = 0;
    if (iVar3 < iVar6) {
      iVar5 = (this->subsumption_queue).buf.sz;
    }
    iVar4 = (iVar3 - iVar6) + iVar5;
    if (iVar4 != 0 && SCARRY4(iVar3 - iVar6,iVar5) == iVar4 < 0) {
      iVar6 = ((iVar5 + iVar3) - iVar6) + 1;
      do {
        iVar3 = (this->subsumption_queue).first;
        local_44 = (this->subsumption_queue).buf.data[iVar3];
        iVar3 = iVar3 + 1;
        if (iVar3 == (this->subsumption_queue).buf.sz) {
          iVar3 = 0;
        }
        (this->subsumption_queue).first = iVar3;
        puVar1 = &(this->super_Solver).statistics.simpSteps;
        *puVar1 = *puVar1 + 1;
        if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory[local_44] & 3) == 0)
        {
          ClauseAllocator::reloc(&(this->super_Solver).ca,&local_44,to);
          Queue<unsigned_int>::insert(&this->subsumption_queue,local_44);
        }
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
    }
    ClauseAllocator::reloc(&(this->super_Solver).ca,&this->bwdsub_tmpunit,to);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator &to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    occurs.cleanAll();
    if (occurs.size() >= nVars()) {
        for (int i = 0; i < nVars(); i++) {
            vec<CRef> &cs = occurs[i];
            assert((solves == 0 || cs.size() == 0) && "There should be no occurrences during solving");
            for (int j = 0; j < cs.size(); j++) ca.reloc(cs[j], to);
            statistics.simpSteps += cs.size();
        }
    }

    // Subsumption queue:
    //
    assert((solves == 0 || subsumption_queue.size() == 0) &&
           "There should be no occurrences subsumption candidates during solving");
    for (int i = subsumption_queue.size(); i > 0; i--) {
        CRef cr = subsumption_queue.peek();
        subsumption_queue.pop();
        statistics.simpSteps++;
        if (ca[cr].mark()) continue;
        ca.reloc(cr, to);
        subsumption_queue.insert(cr);
    }

    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}